

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O1

void Cec3_ManCreateClasses(Gia_Man_t *p,Cec3_Man_t *pMan)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Gia_Rpr_t *pGVar5;
  int *piVar6;
  void *__s;
  ulong uVar7;
  int iVar8;
  Gia_Obj_t *pGVar9;
  long lVar10;
  ulong uVar11;
  size_t __size;
  long lVar12;
  uint nTableSize;
  timespec ts;
  timespec local_40;
  
  iVar4 = p->nSimWords;
  if (p->pReprs != (Gia_Rpr_t *)0x0) {
    free(p->pReprs);
    p->pReprs = (Gia_Rpr_t *)0x0;
  }
  if (p->pNexts != (int *)0x0) {
    free(p->pNexts);
    p->pNexts = (int *)0x0;
  }
  iVar8 = p->nObjs;
  pGVar5 = (Gia_Rpr_t *)calloc((long)iVar8,4);
  p->pReprs = pGVar5;
  __size = (long)iVar8 << 2;
  piVar6 = (int *)malloc(__size);
  memset(piVar6,0xff,__size);
  p->pNexts = piVar6;
  uVar3 = iVar8 - 1;
  while( true ) {
    do {
      nTableSize = uVar3 + 1;
      uVar2 = uVar3 & 1;
      uVar3 = nTableSize;
    } while (uVar2 != 0);
    if (nTableSize < 9) break;
    iVar8 = 5;
    while (nTableSize % (iVar8 - 2U) != 0) {
      uVar2 = iVar8 * iVar8;
      iVar8 = iVar8 + 2;
      if (nTableSize < uVar2) goto LAB_0064b7b7;
    }
  }
LAB_0064b7b7:
  __s = malloc((long)(int)nTableSize << 2);
  memset(__s,0xff,(long)(int)nTableSize << 2);
  uVar3 = p->nObjs;
  if ((0 < (int)uVar3) && (pGVar9 = p->pObjs, pGVar9 != (Gia_Obj_t *)0x0)) {
    lVar12 = 0;
    lVar10 = 0;
    do {
      p->pReprs[lVar10] = (Gia_Rpr_t)((uint)p->pReprs[lVar10] | 0xfffffff);
      if (-1 < (int)*(uint *)(&pGVar9->field_0x0 + lVar12) ||
          (~*(uint *)(&pGVar9->field_0x0 + lVar12) & 0x1fffffff) == 0) {
        uVar3 = p->nSimWords * (int)lVar10;
        if (((int)uVar3 < 0) || (p->vSims->nSize <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        uVar3 = Cec3_ManSimHashKey(p->vSims->pArray + uVar3,iVar4,nTableSize);
        if (((int)uVar3 < 0) || ((int)nTableSize <= (int)uVar3)) {
          __assert_fail("Key >= 0 && Key < nTableSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSatG.c"
                        ,0x273,"void Cec3_ManCreateClasses(Gia_Man_t *, Cec3_Man_t *)");
        }
        uVar2 = *(uint *)((long)__s + (ulong)uVar3 * 4);
        if ((long)(int)uVar2 == -1) {
          *(int *)((long)__s + (ulong)uVar3 * 4) = (int)lVar10;
        }
        else {
          if (lVar10 <= (int)uVar2 && uVar2 != 0xfffffff) {
            __assert_fail("Num == GIA_VOID || Num < Id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x400,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
          }
          p->pReprs[lVar10] = (Gia_Rpr_t)((uint)p->pReprs[lVar10] & 0xf0000000 | uVar2 & 0xfffffff);
        }
      }
      lVar10 = lVar10 + 1;
      uVar3 = p->nObjs;
      if ((int)uVar3 <= lVar10) break;
      pGVar9 = p->pObjs;
      lVar12 = lVar12 + 0xc;
    } while (pGVar9 != (Gia_Obj_t *)0x0);
  }
  if (0 < (int)uVar3) {
    pGVar5 = p->pReprs;
    uVar7 = (ulong)uVar3;
    do {
      uVar11 = (ulong)(uint)pGVar5[uVar7 - 1] & 0xfffffff;
      if (uVar11 != 0xfffffff) {
        piVar6 = p->pNexts;
        piVar6[uVar7 - 1] = piVar6[uVar11];
        piVar6[uVar11] = (int)uVar7 + -1;
      }
      bVar1 = 1 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar1);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (0 < p->nObjs) {
    lVar12 = 0;
    do {
      if (((~(uint)p->pReprs[lVar12] & 0xfffffff) == 0) && (0 < p->pNexts[lVar12])) {
        Cec3_ManSimClassRefineOne(p,(int)lVar12);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < p->nObjs);
  }
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  pMan->timeRefine = pMan->timeRefine + lVar12 + lVar10;
  return;
}

Assistant:

void Cec3_ManCreateClasses( Gia_Man_t * p, Cec3_Man_t * pMan )
{
    abctime clk;
    Gia_Obj_t * pObj;
    int nWords = p->nSimWords;
    int * pTable, nTableSize, i, Key;
    // allocate representation
    ABC_FREE( p->pReprs );
    ABC_FREE( p->pNexts );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    p->pNexts = ABC_FALLOC( int, Gia_ManObjNum(p) );
    // hash each node by its simulation info
    nTableSize = Abc_PrimeCudd( Gia_ManObjNum(p) );
    pTable = ABC_FALLOC( int, nTableSize );
    Gia_ManForEachObj( p, pObj, i )
    {
        p->pReprs[i].iRepr = GIA_VOID;
        if ( Gia_ObjIsCo(pObj) )
            continue;
        Key = Cec3_ManSimHashKey( Cec3_ObjSim(p, i), nWords, nTableSize );
        assert( Key >= 0 && Key < nTableSize );
        if ( pTable[Key] == -1 )
            pTable[Key] = i;
        else
            Gia_ObjSetRepr( p, i, pTable[Key] );
    }
    // create classes
    for ( i = Gia_ManObjNum(p) - 1; i >= 0; i-- )
    {
        int iRepr = Gia_ObjRepr(p, i);
        if ( iRepr == GIA_VOID )
            continue;
        Gia_ObjSetNext( p, i, Gia_ObjNext(p, iRepr) );
        Gia_ObjSetNext( p, iRepr, i );
    }
    ABC_FREE( pTable );
    clk = Abc_Clock();
    Gia_ManForEachClass0( p, i )
        Cec3_ManSimClassRefineOne( p, i );
    pMan->timeRefine += Abc_Clock() - clk;
}